

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.h
# Opt level: O0

void __thiscall
mvm::
interpreter<mvm::test::test_instr_set_extra,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>>>,mvm::test::meta_double_stack<mvm::value_stack<mvm::list::mplist<double>>>>>
::
produce_unroll<mvm::value_stack<mvm::list::mplist<unsigned_int>>,std::tuple<unsigned_int,unsigned_int>,0ul,1ul>
          (interpreter<mvm::test::test_instr_set_extra,mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>>>,mvm::test::meta_double_stack<mvm::value_stack<mvm::list::mplist<double>>>>>
           *this,tuple<unsigned_int,_unsigned_int> *arg)

{
  value_stack<mvm::list::mplist<unsigned_int>_> *pvVar1;
  __tuple_element_t<0UL,_tuple<unsigned_int,_unsigned_int>_> *val;
  __tuple_element_t<1UL,_tuple<unsigned_int,_unsigned_int>_> *val_00;
  tuple<unsigned_int,_unsigned_int> *arg_local;
  interpreter<mvm::test::test_instr_set_extra,_mvm::list::mplist<mvm::meta_bytecode<mvm::bytecode_serializer>,_mvm::meta_value_stack<mvm::value_stack<mvm::list::mplist<unsigned_int>_>_>,_mvm::test::meta_double_stack<mvm::value_stack<mvm::list::mplist<double>_>_>_>_>
  *this_local;
  
  pvVar1 = std::
           get<mvm::value_stack<mvm::list::mplist<unsigned_int>>,mvm::bytecode_serializer,mvm::value_stack<mvm::list::mplist<unsigned_int>>,mvm::value_stack<mvm::list::mplist<double>>>
                     ((tuple<mvm::bytecode_serializer,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>,_mvm::value_stack<mvm::list::mplist<double>_>_>
                       *)(this + 8));
  val = std::get<0ul,unsigned_int,unsigned_int>(arg);
  value_stack<mvm::list::mplist<unsigned_int>_>::push<unsigned_int>(pvVar1,val);
  pvVar1 = std::
           get<mvm::value_stack<mvm::list::mplist<unsigned_int>>,mvm::bytecode_serializer,mvm::value_stack<mvm::list::mplist<unsigned_int>>,mvm::value_stack<mvm::list::mplist<double>>>
                     ((tuple<mvm::bytecode_serializer,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>,_mvm::value_stack<mvm::list::mplist<double>_>_>
                       *)(this + 8));
  val_00 = std::get<1ul,unsigned_int,unsigned_int>(arg);
  value_stack<mvm::list::mplist<unsigned_int>_>::push<unsigned_int>(pvVar1,val_00);
  return;
}

Assistant:

void interpreter<Set, InstancesList>::produce_unroll(
    T &&arg, std::index_sequence<Is...>) {

  (std::get<IS>(m_instances)
       .template push<typename std::tuple_element<Is, std::decay_t<T>>::type>(
           std::get<Is>(std::forward<T>(arg))),
   ...);
}